

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.cpp
# Opt level: O3

void __thiscall
trt_pose::parse::munkresStep5
          (parse *this,float *cost_graph,int M,CoverTable *cover_table,int nrows,int ncols)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  int iVar4;
  ulong uVar5;
  undefined4 in_register_00000014;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  bool bVar9;
  int j;
  parse *ppVar10;
  float in_XMM0_Da;
  float fVar11;
  
  iVar4 = (int)cover_table;
  lVar6 = CONCAT44(in_register_00000014,M);
  uVar7 = (ulong)cover_table & 0xffffffff;
  uVar8 = (ulong)(uint)nrows;
  if (0 < iVar4) {
    lVar1 = (long)(int)cost_graph * 4;
    uVar5 = 0;
    bVar9 = false;
    ppVar10 = this;
    do {
      if (0 < nrows) {
        uVar3 = 0;
        fVar11 = in_XMM0_Da;
        do {
          if (((1L << ((byte)uVar5 & 0x3f) &
               *(ulong *)(*(long *)(lVar6 + 8) + (uVar5 >> 6 & 0x3ffffff) * 8)) == 0) &&
             ((*(ulong *)(*(long *)(lVar6 + 0x30) + (uVar3 >> 6 & 0x3ffffff) * 8) >> (uVar3 & 0x3f)
              & 1) == 0)) {
            if (bVar9) {
              in_XMM0_Da = *(float *)(ppVar10 + uVar3 * 4);
              bVar9 = true;
              if (fVar11 <= in_XMM0_Da) goto LAB_00103291;
            }
            else {
              in_XMM0_Da = *(float *)(ppVar10 + uVar3 * 4);
              bVar9 = true;
            }
          }
          else {
LAB_00103291:
            in_XMM0_Da = fVar11;
          }
          uVar3 = uVar3 + 1;
          fVar11 = in_XMM0_Da;
        } while (uVar8 != uVar3);
      }
      uVar5 = uVar5 + 1;
      ppVar10 = ppVar10 + lVar1;
    } while (uVar5 != uVar7);
    if (0 < iVar4) {
      lVar2 = *(long *)(lVar6 + 8);
      uVar5 = 0;
      ppVar10 = this;
      do {
        if ((*(ulong *)(lVar2 + (uVar5 >> 6 & 0x3ffffff) * 8) >> (uVar5 & 0x3f) & 1) != 0 &&
            0 < nrows) {
          uVar3 = 0;
          do {
            *(float *)(ppVar10 + uVar3 * 4) = *(float *)(ppVar10 + uVar3 * 4) + in_XMM0_Da;
            uVar3 = uVar3 + 1;
          } while (uVar8 != uVar3);
        }
        uVar5 = uVar5 + 1;
        ppVar10 = ppVar10 + lVar1;
      } while (uVar5 != uVar7);
    }
  }
  if (0 < nrows) {
    lVar6 = *(long *)(lVar6 + 0x30);
    uVar5 = 0;
    do {
      uVar3 = uVar7;
      ppVar10 = this;
      if ((*(ulong *)(lVar6 + (uVar5 >> 6 & 0x3ffffff) * 8) >> (uVar5 & 0x3f) & 1) == 0 && 0 < iVar4
         ) {
        do {
          *(float *)ppVar10 = *(float *)ppVar10 - in_XMM0_Da;
          uVar3 = uVar3 - 1;
          ppVar10 = ppVar10 + (long)(int)cost_graph * 4;
        } while (uVar3 != 0);
      }
      uVar5 = uVar5 + 1;
      this = this + 4;
    } while (uVar5 != uVar8);
  }
  return;
}

Assistant:

void munkresStep5(float *cost_graph, const int M, const CoverTable &cover_table,
                  const int nrows, const int ncols) {
  bool valid = false;
  float min;
  for (int i = 0; i < nrows; i++) {
    for (int j = 0; j < ncols; j++) {
      if (!cover_table.isCovered(i, j)) {
        if (!valid) {
          min = cost_graph[i * M + j];
          valid = true;
        } else if (cost_graph[i * M + j] < min) {
          min = cost_graph[i * M + j];
        }
      }
    }
  }

  for (int i = 0; i < nrows; i++) {
    if (cover_table.isRowCovered(i)) {
      for (int j = 0; j < ncols; j++) {
        cost_graph[i * M + j] += min;
      }
      //       cost_graph.addToRow(i, min);
    }
  }
  for (int j = 0; j < ncols; j++) {
    if (!cover_table.isColCovered(j)) {
      for (int i = 0; i < nrows; i++) {
        cost_graph[i * M + j] -= min;
      }
      //       cost_graph.addToCol(j, -min);
    }
  }
}